

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O2

int ndn_hmac_verify(uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size,
                   ndn_hmac_key_t *hmac_key)

{
  int iVar1;
  int iVar2;
  uint8_t auStack_38 [8];
  uint8_t input_hmac [32];
  
  if (sig_size == 0x20) {
    input_hmac[8] = '\0';
    input_hmac[9] = '\0';
    input_hmac[10] = '\0';
    input_hmac[0xb] = '\0';
    input_hmac[0xc] = '\0';
    input_hmac[0xd] = '\0';
    input_hmac[0xe] = '\0';
    input_hmac[0xf] = '\0';
    input_hmac[0x10] = '\0';
    input_hmac[0x11] = '\0';
    input_hmac[0x12] = '\0';
    input_hmac[0x13] = '\0';
    input_hmac[0x14] = '\0';
    input_hmac[0x15] = '\0';
    input_hmac[0x16] = '\0';
    input_hmac[0x17] = '\0';
    auStack_38[0] = '\0';
    auStack_38[1] = '\0';
    auStack_38[2] = '\0';
    auStack_38[3] = '\0';
    auStack_38[4] = '\0';
    auStack_38[5] = '\0';
    auStack_38[6] = '\0';
    auStack_38[7] = '\0';
    input_hmac[0] = '\0';
    input_hmac[1] = '\0';
    input_hmac[2] = '\0';
    input_hmac[3] = '\0';
    input_hmac[4] = '\0';
    input_hmac[5] = '\0';
    input_hmac[6] = '\0';
    input_hmac[7] = '\0';
    ndn_hmac_sha256(input_value,input_size,hmac_key,auStack_38);
    iVar1 = ndn_const_time_memcmp(auStack_38,sig_value,0x20);
    iVar2 = -0x1d;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return -0x17;
}

Assistant:

int
ndn_hmac_verify(const uint8_t* input_value, uint32_t input_size,
                const uint8_t* sig_value, uint32_t sig_size,
                const ndn_hmac_key_t* hmac_key)
{
  if (sig_size != NDN_SEC_SHA256_HASH_SIZE)
    return NDN_SEC_WRONG_SIG_SIZE;

  uint8_t input_hmac[NDN_SEC_SHA256_HASH_SIZE] = {0};
  ndn_hmac_sha256(input_value, input_size, hmac_key, input_hmac);
  if (ndn_const_time_memcmp(input_hmac, sig_value, sizeof(input_hmac)) != NDN_SUCCESS)
    return NDN_SEC_FAIL_VERIFY_SIG;
  else
    return NDN_SUCCESS;
}